

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O1

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Regular>::Connect
               (BenchmarkContext *context,int64_t numSlots)

{
  size_type __n;
  Storage<wigwag::token> *pSVar1;
  pointer psVar2;
  ulong *puVar3;
  ulong uVar4;
  long lVar5;
  size_type sVar6;
  long lVar7;
  StorageArray<wigwag::token> c;
  HandlerType handler;
  IOperationProfilerPtr op;
  vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_> s;
  string local_f8;
  StorageArray<wigwag::token> local_d8;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  ulong local_a8;
  BenchmarkContext *local_a0;
  long local_98;
  size_type local_90;
  long local_88;
  long local_80;
  anon_class_8_1_54a39803 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_> local_68;
  _Any_data local_50;
  code *local_40;
  
  __n = context->_iterationsCount;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:25:45)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:25:45)>
             ::_M_manager;
  std::vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_>::vector
            (&local_68,__n,(allocator_type *)&local_f8);
  local_a8 = __n * numSlots;
  uVar4 = 0xffffffffffffffff;
  if (local_a8 * 8 < 0xfffffffffffffff8) {
    uVar4 = local_a8 * 8 + 8;
  }
  local_d8._size = local_a8;
  puVar3 = (ulong *)operator_new__(-(ulong)(local_a8 >> 0x3d != 0) | uVar4);
  *puVar3 = local_a8;
  local_d8._arr = (Storage<wigwag::token> *)(puVar3 + 1);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"connect","");
  (*context->_vptr_BenchmarkContext[3])(&local_78,context,&local_f8,local_a8);
  local_a0 = context;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (0 < (long)__n) {
    local_98 = numSlots * 8;
    lVar5 = 0;
    sVar6 = 0;
    local_90 = __n;
    local_88 = numSlots;
    do {
      lVar7 = local_88;
      local_80 = lVar5;
      if (0 < local_88) {
        do {
          psVar2 = local_68.
                   super__Vector_base<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pSVar1 = local_d8._arr;
          std::function<void_()>::function
                    ((function<void_()> *)&local_50,(function<void_()> *)&local_c8);
          wigwag::signal<void()>::connect<std::function<void()>>
                    ((signal<void()> *)&local_f8,(function<void_()> *)(psVar2 + sVar6),
                     (handler_attributes)&local_50);
          *(pointer *)((long)pSVar1 + lVar5) = local_f8._M_dataplus._M_p;
          local_f8._M_dataplus._M_p = (pointer)0x0;
          if (local_40 != (code *)0x0) {
            (*local_40)(&local_50,&local_50,__destroy_functor);
          }
          lVar5 = lVar5 + 8;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      sVar6 = sVar6 + 1;
      lVar5 = local_80 + local_98;
    } while (sVar6 != local_90);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"disconnect","");
  local_78.c = &local_d8;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Regular>::Connect(benchmarks::BenchmarkContext&,long)::_lambda()_1_>
            (local_a0,&local_f8,local_a8,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_d8._arr != (Storage<wigwag::token> *)0x0) {
    operator_delete__(local_d8._arr + -1);
  }
  std::vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_>::~vector
            (&local_68);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  return;
}

Assistant:

static void Connect(BenchmarkContext& context, int64_t numSlots)
        {
            const auto n = context.GetIterationsCount();

            HandlerType handler = SignalsDesc_::MakeHandler();
            std::vector<SignalType> s(n);
            StorageArray<ConnectionType> c(numSlots * n);

            {
                auto op = context.Profile("connect", numSlots * n);
                for (int64_t j = 0; j < n; ++j)
                    for (int64_t i = 0; i < numSlots; ++i)
                        c[i + j * numSlots].Construct(s[j].connect(handler));
            }

            context.Profile("disconnect", numSlots * n, [&]{ c.Destruct(); });
        }